

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arenas_lookup_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  rtree_ctx_cache_elm_t *prVar1;
  uint *puVar2;
  rtree_leaf_elm_t *prVar3;
  int iVar4;
  uint *puVar5;
  uint *key;
  ulong uVar6;
  ulong uVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_leaf_elm_t *prVar10;
  rtree_ctx_t *ctx;
  size_t __n;
  bool bVar11;
  rtree_ctx_t local_1b0;
  
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (newp == (void *)0x0) {
    key = (uint *)0x0;
  }
  else {
    iVar4 = 0x16;
    if (newlen != 8) goto LAB_01d99f36;
    key = *newp;
  }
  if (tsd == (tsd_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  puVar5 = (uint *)((ulong)key & 0xffffffffc0000000);
  uVar6 = (ulong)(((uint)((ulong)key >> 0x1e) & 0xf) << 4);
  prVar10 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar6);
  puVar2 = *(uint **)((long)&ctx->cache[0].leafkey + uVar6);
  if (puVar2 == puVar5) {
    prVar10 = (rtree_leaf_elm_t *)
              ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + (long)prVar10[1].le_bits.repr);
  }
  else if ((uint *)ctx->l2_cache[0].leafkey == puVar5) {
    prVar3 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)puVar2;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar10[1].le_bits.repr;
    (prVar10->le_bits).repr = puVar5;
    prVar10[1].le_bits.repr = prVar3;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar3->le_bits).repr + (ulong)((uint)key >> 9 & 0x1ffff8));
  }
  else {
    prVar8 = ctx->l2_cache + 1;
    if ((uint *)ctx->l2_cache[1].leafkey == puVar5) {
      uVar7 = 0;
      bVar11 = false;
    }
    else {
      uVar6 = 1;
      prVar9 = prVar8;
      do {
        uVar7 = uVar6;
        bVar11 = 6 < uVar7;
        if (uVar7 == 7) goto LAB_01d9a001;
        prVar8 = prVar9 + 1;
        prVar1 = prVar9 + 1;
        uVar6 = uVar7 + 1;
        prVar9 = prVar8;
      } while ((uint *)prVar1->leafkey != puVar5);
      bVar11 = 6 < uVar7;
    }
    prVar3 = prVar8->leaf;
    prVar8->leafkey = ctx->l2_cache[uVar7].leafkey;
    prVar8->leaf = ctx->l2_cache[uVar7].leaf;
    ctx->l2_cache[uVar7].leafkey = (uintptr_t)puVar2;
    ctx->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)prVar10[1].le_bits.repr;
    (prVar10->le_bits).repr = puVar5;
    prVar10[1].le_bits.repr = prVar3;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
LAB_01d9a001:
    if (bVar11) {
      prVar10 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)key,false
                           ,false);
      puVar5 = key;
    }
  }
  if (prVar10 != (rtree_leaf_elm_t *)0x0) {
    puVar5 = (uint *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80);
  }
  iVar4 = 0x16;
  if (((prVar10 != (rtree_leaf_elm_t *)0x0) && (puVar5 != (uint *)0x0)) &&
     (duckdb_je_arenas[*puVar5 & 0xfff].repr != (void *)0x0)) {
    local_1b0.cache[0].leafkey._0_4_ =
         *(undefined4 *)((long)duckdb_je_arenas[*puVar5 & 0xfff].repr + 0x13468);
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar6 = *oldlenp;
      if (uVar6 != 4) {
        __n = 4;
        if (uVar6 < 4) {
          __n = uVar6;
        }
        switchD_012dd528::default(oldp,&local_1b0,__n);
        *oldlenp = __n;
        goto LAB_01d99f36;
      }
      *(undefined4 *)oldp = (undefined4)local_1b0.cache[0].leafkey;
    }
    iVar4 = 0;
  }
LAB_01d99f36:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar4;
}

Assistant:

static int
arenas_lookup_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	void *ptr;
	emap_full_alloc_ctx_t alloc_ctx;
	bool ptr_not_present;
	arena_t *arena;

	ptr = NULL;
	ret = EINVAL;
	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(ptr, void *);
	ptr_not_present = emap_full_alloc_ctx_try_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
		&alloc_ctx);
	if (ptr_not_present || alloc_ctx.edata == NULL) {
		goto label_return;
	}

	arena = arena_get_from_edata(alloc_ctx.edata);
	if (arena == NULL) {
		goto label_return;
	}

	arena_ind = arena_ind_get(arena);
	READ(arena_ind, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}